

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O3

void __thiscall OpenMD::GofRAngle::processHistogram(GofRAngle *this)

{
  int iVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  RealType RVar10;
  double dVar11;
  double dVar12;
  
  iVar1 = (this->super_RadialDistrFunc).nPairs_;
  RVar10 = Snapshot::getVolume(((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->sman_->
                               currentSnapshot_);
  pvVar2 = (this->histogram_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->histogram_).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2;
  if (lVar6 != 0) {
    uVar5 = (lVar6 >> 3) * -0x5555555555555555;
    pvVar3 = (this->avgGofr_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = 0;
    do {
      lVar6 = *(long *)&pvVar2[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
      lVar8 = (long)*(pointer *)
                     ((long)&pvVar2[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8) - lVar6;
      if (lVar8 != 0) {
        dVar11 = (double)(uVar7 & 0xffffffff) * this->deltaR_;
        dVar12 = this->deltaR_ + dVar11;
        lVar4 = *(long *)&pvVar3[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        uVar9 = 0;
        do {
          *(double *)(lVar4 + uVar9 * 8) =
               (double)*(int *)(lVar6 + uVar9 * 4) /
               ((dVar12 * dVar12 * dVar12 - dVar11 * dVar11 * dVar11) *
               ((((double)iVar1 / RVar10) * 12.566370614359172) / 3.0)) +
               *(double *)(lVar4 + uVar9 * 8);
          uVar9 = uVar9 + 1;
        } while ((uVar9 & 0xffffffff) < (ulong)(lVar8 >> 2));
      }
      uVar7 = uVar7 + 1;
    } while ((uVar7 & 0xffffffff) <= uVar5 && uVar5 - (uVar7 & 0xffffffff) != 0);
  }
  return;
}

Assistant:

void GofRAngle::processHistogram() {
    int nPairs = getNPairs();
    RealType volume =
        info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();
    RealType pairDensity  = nPairs / volume;
    RealType pairConstant = (4.0 * Constants::PI * pairDensity) / 3.0;

    for (unsigned int i = 0; i < histogram_.size(); ++i) {
      RealType rLower = i * deltaR_;
      RealType rUpper = rLower + deltaR_;
      RealType volSlice =
          (rUpper * rUpper * rUpper) - (rLower * rLower * rLower);
      RealType nIdeal = volSlice * pairConstant;

      for (unsigned int j = 0; j < histogram_[i].size(); ++j) {
        avgGofr_[i][j] += histogram_[i][j] / nIdeal;
      }
    }
  }